

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR reparse_unary_expr(ly_ctx *ctx,lyxp_expr *exp,uint32_t *tok_idx,uint32_t depth)

{
  uint32_t tok_idx_00;
  LY_ERR ret__;
  LY_ERR LVar1;
  uint32_t tok_idx_01;
  
  tok_idx_00 = *tok_idx;
  tok_idx_01 = tok_idx_00;
  while (((exp->used != tok_idx_01 && (exp->tokens[tok_idx_01] == LYXP_TOKEN_OPER_MATH)) &&
         (exp->expr[exp->tok_pos[tok_idx_01]] == '-'))) {
    exp_repeat_push(exp,tok_idx_00,LYXP_EXPR_UNARY);
    tok_idx_01 = *tok_idx + 1;
    *tok_idx = tok_idx_01;
  }
  LVar1 = reparse_path_expr(ctx,exp,tok_idx,depth);
  while( true ) {
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    if (exp->used == *tok_idx) break;
    if (exp->tokens[*tok_idx] != LYXP_TOKEN_OPER_UNI) {
      return LY_SUCCESS;
    }
    exp_repeat_push(exp,tok_idx_01,LYXP_EXPR_UNION);
    *tok_idx = *tok_idx + 1;
    LVar1 = reparse_path_expr(ctx,exp,tok_idx,depth);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
reparse_unary_expr(const struct ly_ctx *ctx, struct lyxp_expr *exp, uint32_t *tok_idx, uint32_t depth)
{
    uint32_t prev_exp;
    LY_ERR rc;

    /* ('-')* */
    prev_exp = *tok_idx;
    while (!lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_OPER_MATH) &&
            (exp->expr[exp->tok_pos[*tok_idx]] == '-')) {
        exp_repeat_push(exp, prev_exp, LYXP_EXPR_UNARY);
        ++(*tok_idx);
    }

    /* PathExpr */
    prev_exp = *tok_idx;
    rc = reparse_path_expr(ctx, exp, tok_idx, depth);
    LY_CHECK_RET(rc);

    /* ('|' PathExpr)* */
    while (!lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_OPER_UNI)) {
        exp_repeat_push(exp, prev_exp, LYXP_EXPR_UNION);
        ++(*tok_idx);

        rc = reparse_path_expr(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
    }

    return LY_SUCCESS;
}